

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void read_sgrproj_filter(SgrprojInfo *sgrproj_info,SgrprojInfo *ref_sgrproj_info,aom_reader *rb)

{
  uint16_t uVar1;
  int iVar2;
  int bit;
  int iVar3;
  int literal;
  uint uVar4;
  
  uVar4 = 0;
  for (iVar3 = 3; -1 < iVar3; iVar3 = iVar3 + -1) {
    iVar2 = od_ec_decode_bool_q15(&rb->ec,0x4000);
    uVar4 = uVar4 | iVar2 << ((byte)iVar3 & 0x1f);
  }
  sgrproj_info->ep = uVar4;
  if (av1_sgr_params[(int)uVar4].r[0] == 0) {
    sgrproj_info->xqd[0] = 0;
  }
  else {
    uVar1 = aom_read_primitive_refsubexpfin_(rb,0x80,4,(short)ref_sgrproj_info->xqd[0] + 0x60);
    iVar3 = av1_sgr_params[(int)uVar4].r[1];
    sgrproj_info->xqd[0] = uVar1 - 0x60;
    if (iVar3 == 0) {
      iVar3 = 0x5f;
      if ((int)(0xe0 - (uint)uVar1) < 0x5f) {
        iVar3 = 0xe0 - (uint)uVar1;
      }
      iVar2 = -0x20;
      if (-0x20 < iVar3) {
        iVar2 = iVar3;
      }
      goto LAB_001687af;
    }
  }
  uVar1 = aom_read_primitive_refsubexpfin_(rb,0x80,4,(short)ref_sgrproj_info->xqd[1] + 0x20);
  iVar2 = uVar1 - 0x20;
LAB_001687af:
  sgrproj_info->xqd[1] = iVar2;
  ref_sgrproj_info->xqd[1] = iVar2;
  iVar3 = sgrproj_info->xqd[0];
  ref_sgrproj_info->ep = sgrproj_info->ep;
  ref_sgrproj_info->xqd[0] = iVar3;
  return;
}

Assistant:

static inline void read_sgrproj_filter(SgrprojInfo *sgrproj_info,
                                       SgrprojInfo *ref_sgrproj_info,
                                       aom_reader *rb) {
  sgrproj_info->ep = aom_read_literal(rb, SGRPROJ_PARAMS_BITS, ACCT_STR);
  const sgr_params_type *params = &av1_sgr_params[sgrproj_info->ep];

  if (params->r[0] == 0) {
    sgrproj_info->xqd[0] = 0;
    sgrproj_info->xqd[1] =
        aom_read_primitive_refsubexpfin(
            rb, SGRPROJ_PRJ_MAX1 - SGRPROJ_PRJ_MIN1 + 1, SGRPROJ_PRJ_SUBEXP_K,
            ref_sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1, ACCT_STR) +
        SGRPROJ_PRJ_MIN1;
  } else if (params->r[1] == 0) {
    sgrproj_info->xqd[0] =
        aom_read_primitive_refsubexpfin(
            rb, SGRPROJ_PRJ_MAX0 - SGRPROJ_PRJ_MIN0 + 1, SGRPROJ_PRJ_SUBEXP_K,
            ref_sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0, ACCT_STR) +
        SGRPROJ_PRJ_MIN0;
    sgrproj_info->xqd[1] = clamp((1 << SGRPROJ_PRJ_BITS) - sgrproj_info->xqd[0],
                                 SGRPROJ_PRJ_MIN1, SGRPROJ_PRJ_MAX1);
  } else {
    sgrproj_info->xqd[0] =
        aom_read_primitive_refsubexpfin(
            rb, SGRPROJ_PRJ_MAX0 - SGRPROJ_PRJ_MIN0 + 1, SGRPROJ_PRJ_SUBEXP_K,
            ref_sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0, ACCT_STR) +
        SGRPROJ_PRJ_MIN0;
    sgrproj_info->xqd[1] =
        aom_read_primitive_refsubexpfin(
            rb, SGRPROJ_PRJ_MAX1 - SGRPROJ_PRJ_MIN1 + 1, SGRPROJ_PRJ_SUBEXP_K,
            ref_sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1, ACCT_STR) +
        SGRPROJ_PRJ_MIN1;
  }

  memcpy(ref_sgrproj_info, sgrproj_info, sizeof(*sgrproj_info));
}